

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  ulong uVar1;
  SizedPtr mem;
  GetDeallocator local_10;
  
  CleanupList(this);
  mem = Free(this);
  uVar1 = (this->alloc_policy_).policy_;
  if (mem.n != 0 && (uVar1 & 1) == 0) {
    uVar1 = uVar1 & 0xfffffffffffffff8;
    if (uVar1 == 0) {
      local_10.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
    }
    else {
      local_10.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar1 + 0x18);
    }
    anon_unknown_12::GetDeallocator::operator()(&local_10,mem);
  }
  absl::lts_20250127::Mutex::Dtor(&this->mutex_);
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  auto mem = Free();
  if (alloc_policy_.is_user_owned_initial_block()) {
    // Unpoison the initial block, now that it's going back to the user.
    internal::UnpoisonMemoryRegion(mem.p, mem.n);
  } else if (mem.n > 0) {
    GetDeallocator(alloc_policy_.get())(mem);
  }
}